

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_mechanism.c
# Opt level: O3

char * saslmechanism_get_mechanism_name(SASL_MECHANISM_HANDLE sasl_mechanism)

{
  char *pcVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  if (sasl_mechanism == (SASL_MECHANISM_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (char *)0x0;
    }
    pcVar1 = "NULL sasl_mechanism";
    iVar3 = 0x78;
  }
  else {
    pcVar1 = (*sasl_mechanism->sasl_mechanism_interface_description->
               concrete_sasl_mechanism_get_mechanism_name)
                       (sasl_mechanism->concrete_sasl_mechanism_handle);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (char *)0x0;
    }
    pcVar1 = "concrete_sasl_mechanism_get_mechanism_name failed";
    iVar3 = 0x83;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_mechanism.c"
            ,"saslmechanism_get_mechanism_name",iVar3,1,pcVar1);
  return (char *)0x0;
}

Assistant:

const char* saslmechanism_get_mechanism_name(SASL_MECHANISM_HANDLE sasl_mechanism)
{
    const char* result;

    /* Codes_SRS_SASL_MECHANISM_01_016: [If the argument `sasl_mechanism` is NULL, `saslmechanism_get_mechanism_name` shall fail and return a non-zero value.] */
    if (sasl_mechanism == NULL)
    {
        LogError("NULL sasl_mechanism");
        result = NULL;
    }
    else
    {
        /* Codes_SRS_SASL_MECHANISM_01_014: [`saslmechanism_get_mechanism_name` shall call the specific `concrete_sasl_mechanism_get_mechanism_name` function specified in `saslmechanism_create`.] */
        /* Codes_SRS_SASL_MECHANISM_01_015: [On success, `saslmechanism_get_mechanism_name` shall return a pointer to a string with the mechanism name.] */
        /* Codes_SRS_SASL_MECHANISM_01_017: [If the underlying `concrete_sasl_mechanism_get_mechanism_name` fails, `saslmechanism_get_mechanism_name` shall return NULL.] */
        result = sasl_mechanism->sasl_mechanism_interface_description->concrete_sasl_mechanism_get_mechanism_name(sasl_mechanism->concrete_sasl_mechanism_handle);
        if (result == NULL)
        {
            LogError("concrete_sasl_mechanism_get_mechanism_name failed");
        }
    }

    return result;
}